

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  QList<unsigned_int> *pQVar5;
  uchar *puVar6;
  FetchAndConvertPixelsFunc p_Var7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint *puVar12;
  uint *puVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long in_FS_OFFSET;
  IntermediateBuffer intermediate;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  uVar16 = (uint)*fy >> 8 & 0xff;
  iVar9 = *fy >> 0x10;
  iVar18 = image->y2 + -1;
  iVar20 = iVar9 + 1;
  if (iVar18 <= iVar9) {
    iVar20 = iVar18;
  }
  pQVar5 = image->colorTable;
  if (iVar9 < iVar18) {
    iVar18 = iVar9;
  }
  iVar21 = image->y1;
  if (iVar9 < iVar21) {
    iVar20 = iVar21;
    iVar18 = iVar21;
  }
  puVar6 = image->imageData;
  lVar19 = image->bytesPerLine;
  iVar21 = (int)((ulong)((long)end - (long)b) >> 2);
  iVar9 = (fdx >> 0x1f & iVar21 * fdx) + *fx >> 0x10;
  uVar11 = (ulong)(uint)-fdx;
  if (0 < fdx) {
    uVar11 = (ulong)(uint)fdx;
  }
  p_Var7 = qPixelLayouts[image->format].fetchToARGB32PM;
  iVar1 = image->x1;
  iVar8 = iVar1;
  if (iVar1 < iVar9) {
    iVar8 = iVar9;
  }
  iVar21 = (int)((long)(uVar11 * (long)iVar21 + 0xffff) / 0x10000);
  iVar14 = iVar9 + iVar21 + 2;
  iVar17 = image->x2;
  if (iVar14 < image->x2) {
    iVar17 = iVar14;
  }
  uVar11 = 1;
  if (1 < iVar17 - iVar8) {
    uVar11 = (ulong)(uint)(iVar17 - iVar8);
  }
  uVar10 = iVar8 - iVar9;
  uVar22 = 0;
  iVar17 = (int)uVar11;
  puVar12 = (*p_Var7)(intermediate.buffer_rb + (int)uVar10,puVar6 + iVar18 * lVar19,iVar8,iVar17,
                      pQVar5,(QDitherInfo *)0x0);
  puVar13 = (*p_Var7)(intermediate.buffer_ag + (int)uVar10,puVar6 + iVar20 * lVar19,iVar8,iVar17,
                      pQVar5,(QDitherInfo *)0x0);
  lVar15 = (long)iVar9;
  lVar19 = (long)iVar1;
  if (iVar1 <= lVar15) {
    lVar19 = lVar15;
  }
  lVar19 = lVar19 * 4 + lVar15 * -4;
  for (; uVar11 != uVar22; uVar22 = uVar22 + 1) {
    uVar2 = puVar12[uVar22];
    uVar3 = puVar13[uVar22];
    *(uint *)((long)&intermediate + uVar22 * 4 + lVar19) =
         (uVar3 & 0xff00ff) * uVar16 + (uVar2 & 0xff00ff) * (0x100 - uVar16) >> 8 & 0xff00ff;
    *(uint *)((long)&intermediate + uVar22 * 4 + lVar19 + 0x2008) =
         (uVar3 >> 8 & 0xff00ff) * uVar16 + (uVar2 >> 8 & 0xff00ff) * (0x100 - uVar16) >> 8 &
         0xff00ff;
  }
  uVar11 = 0;
  uVar22 = 0;
  if (0 < (int)uVar10) {
    uVar22 = (ulong)uVar10;
  }
  for (; uVar22 != uVar11; uVar11 = uVar11 + 1) {
    intermediate.buffer_rb[uVar11] = intermediate.buffer_rb[(int)uVar10];
    intermediate.buffer_ag[uVar11] = intermediate.buffer_ag[(int)uVar10];
  }
  for (lVar19 = (long)(int)(iVar17 + uVar10); lVar19 < iVar21 + 2; lVar19 = lVar19 + 1) {
    intermediate.buffer_rb[lVar19] = intermediate.buffer_rb[lVar19 + -1];
    intermediate.buffer_ag[lVar19] = intermediate.buffer_ag[lVar19 + -1];
  }
  intermediate_adder(b,end,&intermediate,iVar9,fx,fdx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_simple_scale_helper(uint *b, uint *end, const QTextureData &image,
                                                                     int &fx, int &fy, int fdx, int /*fdy*/)
{
    const QPixelLayout *layout = &qPixelLayouts[image.format];
    const QList<QRgb> *clut = image.colorTable;
    const FetchAndConvertPixelsFunc fetch = layout->fetchToARGB32PM;

    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uchar *s1 = image.scanLine(y1);
    const uchar *s2 = image.scanLine(y2);

    const int disty = (fy & 0x0000ffff) >> 8;
    const int idisty = 256 - disty;
    const int length = end - b;

    // The intermediate buffer is generated in the positive direction
    const int adjust = (fdx < 0) ? fdx * length : 0;
    const int offset = (fx + adjust) >> 16;
    int x = offset;

    Q_DECL_UNINITIALIZED IntermediateBuffer intermediate;
    uint *buf1 = intermediate.buffer_rb;
    uint *buf2 = intermediate.buffer_ag;
    const uint *ptr1;
    const uint *ptr2;

    int count = (qint64(length) * qAbs(fdx) + fixed_scale - 1) / fixed_scale + 2;
    Q_ASSERT(count <= BufferSize + 2);

    if (blendType == BlendTransformedBilinearTiled) {
        x %= image.width;
        if (x < 0)
            x += image.width;
        int len1 = qMin(count, image.width - x);
        int len2 = qMin(x, count - len1);

        ptr1 = fetch(buf1, s1, x, len1, clut, nullptr);
        ptr2 = fetch(buf2, s2, x, len1, clut, nullptr);
        for (int i = 0; i < len1; ++i) {
            uint t = ptr1[i];
            uint b = ptr2[i];
            buf1[i] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            buf2[i] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        }

        if (len2) {
            ptr1 = fetch(buf1 + len1, s1, 0, len2, clut, nullptr);
            ptr2 = fetch(buf2 + len1, s2, 0, len2, clut, nullptr);
            for (int i = 0; i < len2; ++i) {
                uint t = ptr1[i];
                uint b = ptr2[i];
                buf1[i + len1] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
                buf2[i + len1] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
            }
        }
        // Generate the rest by repeatedly repeating the previous set of pixels
        for (int i = image.width; i < count; ++i) {
            buf1[i] = buf1[i - image.width];
            buf2[i] = buf2[i - image.width];
        }
    } else {
        int start = qMax(x, image.x1);
        int end = qMin(x + count, image.x2);
        int len = qMax(1, end - start);
        int leading = start - x;

        ptr1 = fetch(buf1 + leading, s1, start, len, clut, nullptr);
        ptr2 = fetch(buf2 + leading, s2, start, len, clut, nullptr);

        for (int i = 0; i < len; ++i) {
            uint t = ptr1[i];
            uint b = ptr2[i];
            buf1[i + leading] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            buf2[i + leading] = ((((t >> 8) & 0xff00ff) * idisty + ((b >> 8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        }

        for (int i = 0; i < leading; ++i) {
            buf1[i] = buf1[leading];
            buf2[i] = buf2[leading];
        }
        for (int i = leading + len; i < count; ++i) {
            buf1[i] = buf1[i - 1];
            buf2[i] = buf2[i - 1];
        }
    }

    // Now interpolate the values from the intermediate.buffer to get the final result.
    intermediate_adder(b, end, intermediate, offset, fx, fdx);
}